

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

void PaUtil_SetInterleavedOutputChannels
               (PaUtilBufferProcessor *bp,uint firstChannel,void *data,uint channelCount)

{
  uint channel;
  ulong uVar1;
  uint uVar2;
  
  if (channelCount == 0) {
    channelCount = bp->outputChannelCount;
  }
  for (uVar1 = 0; channelCount != uVar1; uVar1 = uVar1 + 1) {
    uVar2 = firstChannel + (int)uVar1;
    bp->hostOutputChannels[0][uVar2].data = data;
    bp->hostOutputChannels[0][uVar2].stride = channelCount;
    data = (void *)((long)data + (ulong)bp->bytesPerHostOutputSample);
  }
  return;
}

Assistant:

void PaUtil_SetInterleavedOutputChannels( PaUtilBufferProcessor* bp,
        unsigned int firstChannel, void *data, unsigned int channelCount )
{
    unsigned int i;
    unsigned int channel = firstChannel;
    unsigned char *p = (unsigned char*)data;

    if( channelCount == 0 )
        channelCount = bp->outputChannelCount;

    assert( firstChannel < bp->outputChannelCount );
    assert( firstChannel + channelCount <= bp->outputChannelCount );
    assert( bp->hostOutputIsInterleaved );
    
    for( i=0; i< channelCount; ++i )
    {
        PaUtil_SetOutputChannel( bp, channel + i, p, channelCount );
        p += bp->bytesPerHostOutputSample;
    }
}